

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# miniaudio.h
# Opt level: O0

ma_uint64 ma_dr_wav__read_list_label_or_note_to_metadata_obj
                    (ma_dr_wav__metadata_parser *pParser,ma_dr_wav_metadata *pMetadata,
                    ma_uint64 chunkSize,ma_dr_wav_metadata_type type)

{
  ma_uint32 mVar1;
  uint uVar2;
  void *pBufferOut;
  ma_uint8 *pmVar3;
  undefined4 in_ECX;
  int in_EDX;
  undefined4 *in_RSI;
  ma_dr_wav__metadata_parser *in_RDI;
  ma_uint32 sizeIncludingNullTerminator;
  size_t bytesJustRead;
  ma_uint64 totalBytesRead;
  ma_uint8 cueIDBuffer [4];
  undefined4 in_stack_ffffffffffffffc8;
  undefined4 in_stack_ffffffffffffffcc;
  void *in_stack_ffffffffffffffd0;
  ma_dr_wav__metadata_parser *pParser_00;
  ma_uint8 local_20 [4];
  undefined4 local_1c;
  int local_18;
  undefined4 *local_10;
  ma_dr_wav__metadata_parser *local_8;
  
  pParser_00 = (ma_dr_wav__metadata_parser *)0x0;
  local_1c = in_ECX;
  local_10 = in_RSI;
  local_8 = in_RDI;
  local_18 = in_EDX;
  pBufferOut = (void *)ma_dr_wav__metadata_parser_read
                                 ((ma_dr_wav__metadata_parser *)0x0,in_stack_ffffffffffffffd0,
                                  CONCAT44(in_stack_ffffffffffffffcc,in_stack_ffffffffffffffc8),
                                  (ma_uint64 *)0x217ab9);
  if (pBufferOut == (void *)0x4) {
    *local_10 = local_1c;
    mVar1 = ma_dr_wav_bytes_to_u32(local_20);
    local_10[2] = mVar1;
    uVar2 = local_18 - 4;
    if (uVar2 == 0) {
      local_10[3] = 0;
      *(undefined8 *)(local_10 + 4) = 0;
    }
    else {
      local_10[3] = local_18 + -5;
      pmVar3 = ma_dr_wav__metadata_get_memory(local_8,(ulong)uVar2,1);
      *(ma_uint8 **)(local_10 + 4) = pmVar3;
      ma_dr_wav__metadata_parser_read
                (pParser_00,pBufferOut,CONCAT44(uVar2,in_stack_ffffffffffffffc8),
                 (ma_uint64 *)0x217b4a);
    }
  }
  return (ma_uint64)pParser_00;
}

Assistant:

MA_PRIVATE ma_uint64 ma_dr_wav__read_list_label_or_note_to_metadata_obj(ma_dr_wav__metadata_parser* pParser, ma_dr_wav_metadata* pMetadata, ma_uint64 chunkSize, ma_dr_wav_metadata_type type)
{
    ma_uint8 cueIDBuffer[MA_DR_WAV_LIST_LABEL_OR_NOTE_BYTES];
    ma_uint64 totalBytesRead = 0;
    size_t bytesJustRead = ma_dr_wav__metadata_parser_read(pParser, cueIDBuffer, sizeof(cueIDBuffer), &totalBytesRead);
    MA_DR_WAV_ASSERT(pParser->stage == ma_dr_wav__metadata_parser_stage_read);
    if (bytesJustRead == sizeof(cueIDBuffer)) {
        ma_uint32 sizeIncludingNullTerminator;
        pMetadata->type = type;
        pMetadata->data.labelOrNote.cuePointId = ma_dr_wav_bytes_to_u32(cueIDBuffer);
        sizeIncludingNullTerminator = (ma_uint32)chunkSize - MA_DR_WAV_LIST_LABEL_OR_NOTE_BYTES;
        if (sizeIncludingNullTerminator > 0) {
            pMetadata->data.labelOrNote.stringLength = sizeIncludingNullTerminator - 1;
            pMetadata->data.labelOrNote.pString      = (char*)ma_dr_wav__metadata_get_memory(pParser, sizeIncludingNullTerminator, 1);
            MA_DR_WAV_ASSERT(pMetadata->data.labelOrNote.pString != NULL);
            ma_dr_wav__metadata_parser_read(pParser, pMetadata->data.labelOrNote.pString, sizeIncludingNullTerminator, &totalBytesRead);
        } else {
            pMetadata->data.labelOrNote.stringLength = 0;
            pMetadata->data.labelOrNote.pString      = NULL;
        }
    }
    return totalBytesRead;
}